

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabItemBackground(ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImU32 col)

{
  int iVar1;
  ImVec2 *pIVar2;
  ImGuiContext *pIVar3;
  ImU32 col_00;
  float *pfVar4;
  ImVec2 *pIVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  ImVec2 local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar3 = GImGui;
  local_48 = (bb->Min).x;
  local_58._4_4_ = 0.0;
  pfVar4 = &(GImGui->Style).FrameRounding;
  if (((uint)flags >> 0x15 & 1) == 0) {
    pfVar4 = &(GImGui->Style).TabRounding;
  }
  fVar8 = ((bb->Max).x - local_48) * 0.5 + -1.0;
  fVar9 = *pfVar4;
  if (fVar8 <= *pfVar4) {
    fVar9 = fVar8;
  }
  local_58._0_4_ = (bb->Min).y + 1.0;
  fVar8 = (bb->Max).y + -1.0;
  local_68 = ZEXT416(~-(uint)(fVar9 <= 0.0) & (uint)fVar9);
  iVar7 = (draw_list->_Path).Size;
  iVar1 = (draw_list->_Path).Capacity;
  if (iVar7 == iVar1) {
    iVar7 = iVar7 + 1;
    if (iVar1 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar1 / 2 + iVar1;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar1 < iVar7) {
      _local_58 = ZEXT416((uint)local_58._0_4_);
      pIVar5 = (ImVec2 *)MemAlloc((long)iVar7 << 3);
      pIVar2 = (draw_list->_Path).Data;
      if (pIVar2 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar2,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar5;
      (draw_list->_Path).Capacity = iVar7;
    }
  }
  pIVar2 = (draw_list->_Path).Data;
  iVar7 = (draw_list->_Path).Size;
  pIVar2[iVar7].x = local_48;
  pIVar2[iVar7].y = fVar8;
  (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
  fVar9 = (bb->Min).x + (float)local_68._0_4_;
  local_48 = (float)local_58._0_4_ + (float)local_68._0_4_;
  fStack_4c = (float)local_58._4_4_ + (float)local_68._0_4_;
  local_58._4_4_ = local_48;
  local_58._0_4_ = fVar9;
  fStack_50 = (float)local_68._0_4_ + 0.0;
  local_70.y = local_48;
  local_70.x = fVar9;
  fStack_44 = local_48;
  fStack_40 = local_48;
  fStack_3c = local_48;
  ImDrawList::PathArcToFast(draw_list,&local_70,(float)local_68._0_4_,6,9);
  local_70.y = local_48;
  local_70.x = (bb->Max).x - (float)local_68._0_4_;
  ImDrawList::PathArcToFast(draw_list,&local_70,(float)local_68._0_4_,9,0xc);
  fVar9 = (bb->Max).x;
  iVar7 = (draw_list->_Path).Size;
  iVar1 = (draw_list->_Path).Capacity;
  if (iVar7 == iVar1) {
    iVar7 = iVar7 + 1;
    if (iVar1 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar1 / 2 + iVar1;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar1 < iVar7) {
      pIVar5 = (ImVec2 *)MemAlloc((long)iVar7 << 3);
      pIVar2 = (draw_list->_Path).Data;
      if (pIVar2 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar2,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar5;
      (draw_list->_Path).Capacity = iVar7;
    }
  }
  pIVar2 = (draw_list->_Path).Data;
  iVar7 = (draw_list->_Path).Size;
  pIVar2[iVar7].x = fVar9;
  pIVar2[iVar7].y = fVar8;
  iVar7 = (draw_list->_Path).Size + 1;
  (draw_list->_Path).Size = iVar7;
  ImDrawList::AddConvexPolyFilled(draw_list,(draw_list->_Path).Data,iVar7,col);
  (draw_list->_Path).Size = 0;
  if (0.0 < (pIVar3->Style).TabBorderSize) {
    fVar9 = (bb->Min).x;
    if ((draw_list->_Path).Capacity == 0) {
      pIVar5 = (ImVec2 *)MemAlloc(0x40);
      pIVar2 = (draw_list->_Path).Data;
      if (pIVar2 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar2,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar5;
      (draw_list->_Path).Capacity = 8;
    }
    pIVar2 = (draw_list->_Path).Data;
    iVar7 = (draw_list->_Path).Size;
    pIVar2[iVar7].x = fVar9 + 0.5;
    pIVar2[iVar7].y = fVar8;
    (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
    local_58._0_4_ = (bb->Min).x + (float)local_68._0_4_ + 0.5;
    local_58._4_4_ = (float)local_58._4_4_ + 0.5;
    fStack_50 = fStack_50 + 0.0;
    fStack_4c = fStack_4c + 0.0;
    local_70.y = (float)local_58._4_4_;
    local_70.x = (float)local_58._0_4_;
    ImDrawList::PathArcToFast(draw_list,&local_70,(float)local_68._0_4_,6,9);
    local_70.y = (float)local_58._4_4_;
    local_70.x = ((bb->Max).x - (float)local_68._0_4_) + -0.5;
    ImDrawList::PathArcToFast(draw_list,&local_70,(float)local_68._0_4_,9,0xc);
    fVar9 = (bb->Max).x + -0.5;
    iVar7 = (draw_list->_Path).Size;
    iVar1 = (draw_list->_Path).Capacity;
    if (iVar7 == iVar1) {
      iVar7 = iVar7 + 1;
      if (iVar1 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar1 / 2 + iVar1;
      }
      if (iVar7 < iVar6) {
        iVar7 = iVar6;
      }
      if (iVar1 < iVar7) {
        local_68._0_4_ = fVar9;
        pIVar5 = (ImVec2 *)MemAlloc((long)iVar7 << 3);
        pIVar2 = (draw_list->_Path).Data;
        if (pIVar2 != (ImVec2 *)0x0) {
          memcpy(pIVar5,pIVar2,(long)(draw_list->_Path).Size << 3);
          MemFree((draw_list->_Path).Data);
        }
        (draw_list->_Path).Data = pIVar5;
        (draw_list->_Path).Capacity = iVar7;
        fVar9 = (float)local_68._0_4_;
      }
    }
    pIVar2 = (draw_list->_Path).Data;
    iVar7 = (draw_list->_Path).Size;
    pIVar2[iVar7].x = fVar9;
    pIVar2[iVar7].y = fVar8;
    (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
    col_00 = GetColorU32(5,1.0);
    ImDrawList::AddPolyline
              (draw_list,(draw_list->_Path).Data,(draw_list->_Path).Size,col_00,false,
               (pIVar3->Style).TabBorderSize);
    (draw_list->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImGui::TabItemBackground(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImU32 col)
{
    // While rendering tabs, we trim 1 pixel off the top of our bounding box so they can fit within a regular frame height while looking "detached" from it.
    ImGuiContext& g = *GImGui;
    const float width = bb.GetWidth();
    IM_UNUSED(flags);
    IM_ASSERT(width > 0.0f);
    const float rounding = ImMax(0.0f, ImMin((flags & ImGuiTabItemFlags_Button) ? g.Style.FrameRounding : g.Style.TabRounding, width * 0.5f - 1.0f));
    const float y1 = bb.Min.y + 1.0f;
    const float y2 = bb.Max.y - 1.0f;
    draw_list->PathLineTo(ImVec2(bb.Min.x, y2));
    draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding, y1 + rounding), rounding, 6, 9);
    draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding, y1 + rounding), rounding, 9, 12);
    draw_list->PathLineTo(ImVec2(bb.Max.x, y2));
    draw_list->PathFillConvex(col);
    if (g.Style.TabBorderSize > 0.0f)
    {
        draw_list->PathLineTo(ImVec2(bb.Min.x + 0.5f, y2));
        draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding + 0.5f, y1 + rounding + 0.5f), rounding, 6, 9);
        draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding - 0.5f, y1 + rounding + 0.5f), rounding, 9, 12);
        draw_list->PathLineTo(ImVec2(bb.Max.x - 0.5f, y2));
        draw_list->PathStroke(GetColorU32(ImGuiCol_Border), false, g.Style.TabBorderSize);
    }
}